

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

char * build_gnu_sparse_name(char *dest,char *src)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char *p;
  char buff [64];
  char *local_60;
  char local_58 [64];
  char *local_18;
  size_t in_stack_fffffffffffffff8;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    strcpy(in_RDI,"GNUSparseFile/blank");
  }
  else {
    local_18 = in_RSI;
    sVar1 = strlen(in_RSI);
    local_60 = in_RSI + sVar1;
    while( true ) {
      for (; (local_18 < local_60 && (local_60[-1] == '/')); local_60 = local_60 + -1) {
      }
      if ((local_60 <= local_18 + 1) || ((local_60[-1] != '.' || (local_60[-2] != '/')))) break;
      local_60 = local_60 + -1;
    }
    strcpy(local_58,"GNUSparseFile");
    build_ustar_entry_name(p,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI);
  }
  return in_RDI;
}

Assistant:

static char *
build_gnu_sparse_name(char *dest, const char *src)
{
	char buff[64];
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "GNUSparseFile/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

#if HAVE_GETPID && 0  /* Disable this as pax attribute name. */
	sprintf(buff, "GNUSparseFile.%d", getpid());
#else
	/* If the platform can't fetch the pid, don't include it. */
	strcpy(buff, "GNUSparseFile");
#endif
	/* General case: build a ustar-compatible name adding
	 * "/GNUSparseFile/". */
	build_ustar_entry_name(dest, src, p - src, buff);

	return (dest);
}